

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssertionTest.cpp
# Opt level: O2

void __thiscall
AssertionTest_assertHandlerShouldNotBeCalled_Test::AssertionTest_assertHandlerShouldNotBeCalled_Test
          (AssertionTest_assertHandlerShouldNotBeCalled_Test *this)

{
  AssertionTest::AssertionTest(&this->super_AssertionTest);
  (this->super_AssertionTest).super_Test._vptr_Test = (_func_int **)&PTR__AssertionTest_00175ea0;
  return;
}

Assistant:

TEST_F(AssertionTest, assertHandlerShouldNotBeCalled)
{
    std::int32_t a = 0;
    std::int32_t b = 1;
    CPP_ASSERT(a!=b);
    EXPECT_EQ(0, assertionHandlerCounter_);
    CPP_ASSERT(a!=b, "");
    EXPECT_EQ(0, assertionHandlerCounter_);
}